

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O0

void anon_unknown.dwarf_13ad8::fillSampleCounts(Rand48 *random,SampleCountChannel *scc)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint *puVar5;
  ImageChannel *in_RSI;
  size_t i;
  Edit edit;
  size_t numPixels;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  Edit *in_stack_ffffffffffffffb0;
  ulong local_30;
  Edit local_28;
  ulong local_18;
  ImageChannel *local_10;
  
  local_10 = in_RSI;
  iVar1 = Imf_2_5::ImageChannel::pixelsPerRow(in_RSI);
  iVar2 = Imf_2_5::ImageChannel::pixelsPerColumn(local_10);
  local_18 = (ulong)(iVar1 * iVar2);
  Imf_2_5::SampleCountChannel::Edit::Edit
            (in_stack_ffffffffffffffb0,
             (SampleCountChannel *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  for (local_30 = 0; local_30 < local_18; local_30 = local_30 + 1) {
    lVar4 = Imath_2_5::Rand48::nexti((Rand48 *)0x11e1d8);
    uVar3 = (int)lVar4 +
            ((int)(SUB168(SEXT816(lVar4) * SEXT816(0x6666666666666667),8) >> 2) -
            (SUB164(SEXT816(lVar4) * SEXT816(0x6666666666666667),0xc) >> 0x1f)) * -10;
    puVar5 = Imf_2_5::SampleCountChannel::Edit::sampleCounts(&local_28);
    puVar5[local_30] = uVar3;
  }
  Imf_2_5::SampleCountChannel::Edit::~Edit((Edit *)0x11e269);
  return;
}

Assistant:

void
fillSampleCounts (Rand48 &random, SampleCountChannel &scc)
{
    //
    // Fill the sample count channel with random numbers
    //

    size_t numPixels = scc.pixelsPerRow() * scc.pixelsPerColumn();
    SampleCountChannel::Edit edit (scc);

    for (size_t i = 0; i < numPixels; ++i)
        edit.sampleCounts()[i] = random.nexti() % 10;
}